

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

void stack_init(lua_State *L1,lua_State *L)

{
  StkId pSVar1;
  long lVar2;
  
  pSVar1 = (StkId)luaM_malloc_(L,0x2d0,0);
  (L1->stack).p = pSVar1;
  (L1->tbclist).p = pSVar1;
  for (lVar2 = 8; pSVar1 = (L1->stack).p, lVar2 != 0x2d8; lVar2 = lVar2 + 0x10) {
    *(undefined1 *)((long)pSVar1 + lVar2) = 0;
  }
  (L1->top).p = pSVar1;
  (L1->stack_last).p = pSVar1 + 0x28;
  (L1->base_ci).previous = (CallInfo *)0x0;
  (L1->base_ci).next = (CallInfo *)0x0;
  (L1->base_ci).func.p = pSVar1;
  (L1->base_ci).u.l.savedpc = (Instruction *)0x0;
  (L1->base_ci).nresults = 0;
  (L1->base_ci).callstatus = 2;
  (pSVar1->val).tt_ = '\0';
  lVar2 = (L1->top).offset;
  (L1->top).p = (StkId)(lVar2 + 0x10);
  (L1->base_ci).top.p = (StkId)(lVar2 + 0x150);
  L1->ci = &L1->base_ci;
  return;
}

Assistant:

static void stack_init (lua_State *L1, lua_State *L) {
  int i; CallInfo *ci;
  /* initialize stack array */
  L1->stack.p = luaM_newvector(L, BASIC_STACK_SIZE + EXTRA_STACK, StackValue);
  L1->tbclist.p = L1->stack.p;
  for (i = 0; i < BASIC_STACK_SIZE + EXTRA_STACK; i++)
    setnilvalue(s2v(L1->stack.p + i));  /* erase new stack */
  L1->top.p = L1->stack.p;
  L1->stack_last.p = L1->stack.p + BASIC_STACK_SIZE;
  /* initialize first ci */
  ci = &L1->base_ci;
  ci->next = ci->previous = NULL;
  ci->callstatus = CIST_C;
  ci->func.p = L1->top.p;
  ci->u.c.k = NULL;
  ci->nresults = 0;
  setnilvalue(s2v(L1->top.p));  /* 'function' entry for this 'ci' */
  L1->top.p++;
  ci->top.p = L1->top.p + LUA_MINSTACK;
  L1->ci = ci;
}